

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O1

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args;
  SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *args_2;
  GenvarDeclarationSyntax *pGVar1;
  Token local_48;
  Token local_38;
  
  args = deepClone<slang::syntax::AttributeInstanceSyntax>
                   ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x18),
                    (BumpAllocator *)__child_stack);
  local_38 = parsing::Token::deepClone((Token *)(__fn + 0x50),(BumpAllocator *)__child_stack);
  args_2 = deepClone<slang::syntax::IdentifierNameSyntax>
                     ((SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *)(__fn + 0x60),
                      (BumpAllocator *)__child_stack);
  local_48 = parsing::Token::deepClone((Token *)(__fn + 0x98),(BumpAllocator *)__child_stack);
  pGVar1 = BumpAllocator::
           emplace<slang::syntax::GenvarDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>&,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,args,&local_38,args_2,&local_48);
  return (int)pGVar1;
}

Assistant:

static SyntaxNode* clone(const GenvarDeclarationSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<GenvarDeclarationSyntax>(
        *deepClone(node.attributes, alloc),
        node.keyword.deepClone(alloc),
        *deepClone(node.identifiers, alloc),
        node.semi.deepClone(alloc)
    );
}